

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O1

void benchmark(char *comment,Mat *_in,Option *opt)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  DataReaderFromEmpty dr;
  Extractor ex;
  Net net;
  Mat out;
  char parampath [256];
  double local_260;
  DataReader local_258;
  char *local_250;
  double local_248;
  double local_240;
  undefined1 local_238 [56];
  int local_200;
  size_t local_1f8;
  double local_1f0;
  undefined1 local_1e8 [24];
  Allocator *local_1d0;
  Allocator *pAStack_1c8;
  Allocator *local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  NetPrivate *local_1a0;
  undefined8 uStack_198;
  undefined1 local_188 [32];
  Allocator *local_168;
  int iStack_160;
  int iStack_15c;
  undefined1 auStack_158 [12];
  size_t local_148;
  char local_138 [264];
  
  local_238._0_8_ = _in->data;
  piVar1 = _in->refcount;
  local_238._8_4_ = SUB84(piVar1,0);
  local_238._12_4_ = (undefined4)((ulong)piVar1 >> 0x20);
  local_238._16_8_ = _in->elemsize;
  local_238._24_4_ = _in->elempack;
  local_238._32_8_ = _in->allocator;
  local_238._40_4_ = _in->dims;
  local_238._44_4_ = _in->w;
  local_238._48_4_ = _in->h;
  local_238._52_4_ = _in->d;
  local_200 = _in->c;
  local_1f8 = _in->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  auVar4 = _DAT_00312030;
  auVar3 = _DAT_00312020;
  auVar2 = _DAT_00312010;
  uVar5 = local_200 * (int)local_1f8;
  if (0 < (int)uVar5) {
    lVar8 = (ulong)uVar5 - 1;
    auVar13._8_4_ = (int)lVar8;
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar13 = auVar13 ^ _DAT_00312030;
    do {
      auVar14._8_4_ = (int)uVar9;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar3) ^ auVar4;
      iVar10 = auVar13._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar10 && auVar13._0_4_ < auVar15._0_4_ ||
                  iVar10 < auVar15._4_4_) & 1)) {
        *(undefined4 *)(local_238._0_8_ + uVar9 * 4) = 0x3c23d70a;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)(local_238._0_8_ + uVar9 * 4 + 4) = 0x3c23d70a;
      }
      auVar14 = (auVar14 | auVar2) ^ auVar4;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar10 && (iVar16 != iVar10 || auVar14._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)(local_238._0_8_ + uVar9 * 4 + 8) = 0x3c23d70a;
        *(undefined4 *)(local_238._0_8_ + uVar9 * 4 + 0xc) = 0x3c23d70a;
      }
      uVar9 = uVar9 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar9);
  }
  local_250 = comment;
  ncnn::UnlockedPoolAllocator::clear(&g_blob_pool_allocator);
  ncnn::PoolAllocator::clear(&g_workspace_pool_allocator);
  ncnn::Net::Net((Net *)(local_1e8 + 0x10));
  local_1d0 = *(Allocator **)opt;
  pAStack_1c8 = opt->blob_allocator;
  local_1c0 = opt->workspace_allocator;
  uStack_1b8 = *(undefined8 *)&opt->openmp_blocktime;
  local_1b0 = *(undefined8 *)&opt->use_bf16_storage;
  uStack_1a8._0_1_ = opt->use_shader_pack8;
  uStack_1a8._1_1_ = opt->use_subgroup_basic;
  uStack_1a8._2_1_ = opt->use_subgroup_vote;
  uStack_1a8._3_1_ = opt->use_subgroup_ballot;
  uStack_1a8._4_1_ = opt->use_subgroup_shuffle;
  uStack_1a8._5_1_ = opt->use_image_storage;
  uStack_1a8._6_1_ = opt->use_tensor_storage;
  uStack_1a8._7_1_ = opt->use_weight_fp16_storage;
  local_1a0 = *(NetPrivate **)&opt->flush_denormals;
  uStack_198._0_1_ = opt->use_reserved_4;
  uStack_198._1_1_ = opt->use_reserved_5;
  uStack_198._2_1_ = opt->use_reserved_6;
  uStack_198._3_1_ = opt->use_reserved_7;
  uStack_198._4_1_ = opt->use_reserved_8;
  uStack_198._5_1_ = opt->use_reserved_9;
  uStack_198._6_1_ = opt->use_reserved_10;
  uStack_198._7_1_ = opt->use_reserved_11;
  sprintf(local_138,"%s.param",local_250);
  ncnn::Net::load_param((Net *)(local_1e8 + 0x10),local_138);
  ncnn::DataReader::DataReader(&local_258);
  local_258._vptr_DataReader = (_func_int **)&PTR__DataReader_00349770;
  ncnn::Net::load_model((Net *)(local_1e8 + 0x10),&local_258);
  pvVar6 = ncnn::Net::input_names((Net *)(local_1e8 + 0x10));
  pvVar7 = ncnn::Net::output_names((Net *)(local_1e8 + 0x10));
  if (g_enable_cooling_down == true) {
    sleep(10);
  }
  local_148 = 0;
  local_188._0_8_ = (void *)0x0;
  local_188._8_4_ = 0;
  local_188._12_4_ = 0;
  local_188._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_168 = (Allocator *)0x0;
  iStack_160 = 0;
  iStack_15c = 0;
  auStack_158 = SUB1612((undefined1  [16])0x0,4);
  iVar10 = 8;
  do {
    ncnn::Net::create_extractor((Net *)local_1e8);
    ncnn::Extractor::input
              ((Extractor *)local_1e8,
               *(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start,(Mat *)local_238);
    ncnn::Extractor::extract
              ((Extractor *)local_1e8,
               *(pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start,(Mat *)local_188,0);
    ncnn::Extractor::~Extractor((Extractor *)local_1e8);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  if (g_loop_count < 1) {
    local_260 = 0.0;
    dVar12 = 1.79769313486232e+308;
    dVar11 = -1.79769313486232e+308;
  }
  else {
    local_240 = -1.79769313486232e+308;
    local_248 = 1.79769313486232e+308;
    local_260 = 0.0;
    iVar10 = 0;
    do {
      local_1f0 = ncnn::get_current_time();
      ncnn::Net::create_extractor((Net *)local_1e8);
      ncnn::Extractor::input
                ((Extractor *)local_1e8,
                 *(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,(Mat *)local_238);
      ncnn::Extractor::extract
                ((Extractor *)local_1e8,
                 *(pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,(Mat *)local_188,0);
      ncnn::Extractor::~Extractor((Extractor *)local_1e8);
      dVar11 = ncnn::get_current_time();
      dVar11 = dVar11 - local_1f0;
      dVar12 = dVar11;
      if (local_248 <= dVar11) {
        dVar12 = local_248;
      }
      local_260 = local_260 + dVar11;
      if (dVar11 <= local_240) {
        dVar11 = local_240;
      }
      iVar10 = iVar10 + 1;
      local_248 = dVar12;
      local_240 = dVar11;
    } while (iVar10 < g_loop_count);
  }
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",dVar12,dVar11,
          local_260 / (double)g_loop_count,local_250);
  piVar1 = (int *)CONCAT44(local_188._12_4_,local_188._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_168 == (Allocator *)0x0) {
        if ((void *)local_188._0_8_ != (void *)0x0) {
          free((void *)local_188._0_8_);
        }
      }
      else {
        (*local_168->_vptr_Allocator[3])();
      }
    }
  }
  ncnn::DataReader::~DataReader(&local_258);
  ncnn::Net::~Net((Net *)(local_1e8 + 0x10));
  piVar1 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

#ifdef __EMSCRIPTEN__
#define MODEL_DIR "/working/"
#else
#define MODEL_DIR ""
#endif

    char parampath[256];
    sprintf(parampath, MODEL_DIR "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    const std::vector<const char*>& input_names = net.input_names();
    const std::vector<const char*>& output_names = net.output_names();

    if (g_enable_cooling_down)
    {
        // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
        Sleep(10 * 1000);
#elif defined(__unix__) || defined(__APPLE__)
        sleep(10);
#elif _POSIX_TIMERS
        struct timespec ts;
        ts.tv_sec = 10;
        ts.tv_nsec = 0;
        nanosleep(&ts, &ts);
#else
        // TODO How to handle it ?
#endif
    }

    ncnn::Mat out;

    // warm up
    for (int i = 0; i < g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input(input_names[0], in);
        ex.extract(output_names[0], out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i = 0; i < g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input(input_names[0], in);
            ex.extract(output_names[0], out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}